

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall SimulationDecPOMDPDiscrete::Initialize(SimulationDecPOMDPDiscrete *this)

{
  DecPOMDPDiscreteInterface *pDVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  ostream *poVar6;
  Index s;
  uint uVar7;
  PlanningUnitDecPOMDPDiscrete *this_00;
  Index ja;
  uint uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 local_38 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  this_00 = this->_m_pu;
  sVar4 = (this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  if (sVar4 == 999999) {
    uVar7 = 0;
    local_38 = ZEXT816(0);
    while( true ) {
      sVar4 = PlanningUnitMADPDiscrete::GetNrStates(&this_00->super_PlanningUnitMADPDiscrete);
      if (sVar4 == uVar7) break;
      uVar8 = 0;
      while( true ) {
        uVar5 = (**(code **)((long)*(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))()
        ;
        if (uVar5 == uVar8) break;
        pDVar1 = this->_m_pu->_m_DecPOMDP;
        auVar12._0_8_ = (**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,uVar7,uVar8);
        auVar12._8_56_ = extraout_var;
        auVar2._8_8_ = 0x7fffffffffffffff;
        auVar2._0_8_ = 0x7fffffffffffffff;
        auVar9 = vandpd_avx512vl(auVar12._0_16_,auVar2);
        if ((double)local_38._0_8_ < auVar9._0_8_) {
          pDVar1 = this->_m_pu->_m_DecPOMDP;
          auVar13._0_8_ = (**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,uVar7,uVar8);
          auVar13._8_56_ = extraout_var_00;
          auVar3._8_8_ = 0x7fffffffffffffff;
          auVar3._0_8_ = 0x7fffffffffffffff;
          local_38 = vandpd_avx512vl(auVar13._0_16_,auVar3);
        }
        uVar8 = uVar8 + 1;
      }
      this_00 = this->_m_pu;
      uVar7 = uVar7 + 1;
    }
    dVar10 = log(1e-06 / (double)local_38._0_8_);
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    dVar11 = (double)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                           *(long *)(*(long *)pDVar1 + -0xb0)) + 0x70))
                               ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb0));
    dVar11 = log(dVar11);
    auVar9._0_8_ = dVar10 / dVar11;
    auVar9._8_8_ = 0;
    auVar9 = vroundsd_avx(auVar9,auVar9,10);
    sVar4 = lrint(auVar9._0_8_);
    this->_m_horizon = sVar4;
    poVar6 = std::operator<<((ostream *)&std::cout,"SimulationDecPOMDPDiscrete: Set horizon to ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6," (g ");
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    dVar10 = (double)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                           *(long *)(*(long *)pDVar1 + -0xb0)) + 0x70))
                               ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb0));
    poVar6 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar6," max|R| ");
    poVar6 = std::ostream::_M_insert<double>((double)local_38._0_8_);
    poVar6 = std::operator<<(poVar6,")");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    this->_m_horizon = sVar4;
  }
  if ((this->super_Simulation)._m_verbose == true) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Simulation::RunSimulations horizon ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," nrRuns ");
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)poVar6,(this->super_Simulation)._m_nrRuns);
    poVar6 = std::operator<<(poVar6," seed ");
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)poVar6,(this->super_Simulation)._m_random_seed);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  uVar7 = (this->super_Simulation)._m_random_seed;
  if (uVar7 == 0x7fffffff) {
    return;
  }
  srand(uVar7);
  return;
}

Assistant:

void SimulationDecPOMDPDiscrete::Initialize()
{
    if(_m_pu->GetHorizon()==MAXHORIZON)
    {
        // figure out until what horizon we should sample to get a
        // maximum error smaller than 1-e6
        double maxAbsReward=0;
        for(Index s=0;s!=_m_pu->GetNrStates();++s)
            for(Index ja=0;ja!=_m_pu->GetNrJointActions();++ja)
                if(abs(_m_pu->GetReward(s,ja))>maxAbsReward)
                    maxAbsReward=abs(_m_pu->GetReward(s,ja));
        
        _m_horizon=lrint(ceil((log(1e-6/maxAbsReward)/
                               log(_m_pu->GetDiscount()))));

        //if(GetVerbose()) //FAO: I think this is always useful to print...?
            cout << "SimulationDecPOMDPDiscrete: Set horizon to " << _m_horizon << " (g "
                 << _m_pu->GetDiscount() << " max|R| " << maxAbsReward
                 << ")" << endl;
    }
    else
        _m_horizon=_m_pu->GetHorizon();

    if(GetVerbose())
        cout << "Simulation::RunSimulations horizon " << _m_horizon
             << " nrRuns " << GetNrRuns() << " seed " 
             << GetRandomSeed() << endl;
    
    if(GetRandomSeed()!=illegalRandomSeed)
    {
        // Seed the random number generator
        srand(GetRandomSeed());
    }
}